

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QXcbCursorCacheKey,_unsigned_int>_>::Data
          (Data<QHashPrivate::Node<QXcbCursorCacheKey,_unsigned_int>_> *this,
          Data<QHashPrivate::Node<QXcbCursorCacheKey,_unsigned_int>_> *other)

{
  uchar *puVar1;
  Span *pSVar2;
  Entry *pEVar3;
  qint64 qVar4;
  qint64 qVar5;
  anon_union_8_2_6a82dae8_for_hotspotCacheKey aVar6;
  ulong uVar7;
  Node<QXcbCursorCacheKey,_unsigned_int> *pNVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  R RVar12;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar10 = other->numBuckets;
  sVar11 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar11;
  this->spans = (Span *)0x0;
  RVar12 = allocateSpans(sVar10);
  this->spans = (Span *)RVar12.spans;
  if (RVar12.nSpans != 0) {
    lVar9 = 0;
    sVar10 = 0;
    do {
      pSVar2 = other->spans;
      sVar11 = 0;
      do {
        uVar7 = (ulong)pSVar2->offsets[sVar11 + lVar9];
        if (uVar7 != 0xff) {
          pEVar3 = pSVar2[sVar10].entries;
          pNVar8 = Span<QHashPrivate::Node<QXcbCursorCacheKey,_unsigned_int>_>::insert
                             (this->spans + sVar10,sVar11);
          qVar4 = *(qint64 *)(pEVar3[uVar7].storage.data + 8);
          puVar1 = pEVar3[uVar7].storage.data + 0x10;
          qVar5 = *(qint64 *)puVar1;
          aVar6 = *(anon_union_8_2_6a82dae8_for_hotspotCacheKey *)(puVar1 + 8);
          *(undefined8 *)&pNVar8->key = *(undefined8 *)pEVar3[uVar7].storage.data;
          (pNVar8->key).bitmapCacheKey = qVar4;
          (pNVar8->key).maskCacheKey = qVar5;
          (pNVar8->key).hotspotCacheKey = aVar6;
          *(undefined8 *)&pNVar8->value = *(undefined8 *)(pEVar3[uVar7].storage.data + 0x20);
        }
        sVar11 = sVar11 + 1;
      } while (sVar11 != 0x80);
      sVar10 = sVar10 + 1;
      lVar9 = lVar9 + 0x90;
    } while (sVar10 != RVar12.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }